

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O0

void __thiscall
mocker::nasm::Section::
emplaceLine<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::NumericConstant>>
          (Section *this,string *label,OpType *args,shared_ptr<mocker::nasm::Register> *args_1,
          shared_ptr<mocker::nasm::NumericConstant> *args_2)

{
  shared_ptr<mocker::nasm::BinaryInst> local_40;
  shared_ptr<mocker::nasm::NumericConstant> *local_30;
  shared_ptr<mocker::nasm::NumericConstant> *args_local_2;
  shared_ptr<mocker::nasm::Register> *args_local_1;
  OpType *args_local;
  string *label_local;
  Section *this_local;
  
  local_30 = args_2;
  args_local_2 = (shared_ptr<mocker::nasm::NumericConstant> *)args_1;
  args_local_1 = (shared_ptr<mocker::nasm::Register> *)args;
  args_local = (OpType *)label;
  label_local = &this->name;
  std::
  make_shared<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::NumericConstant>>
            ((OpType *)&local_40,(shared_ptr<mocker::nasm::Register> *)args,
             (shared_ptr<mocker::nasm::NumericConstant> *)args_1);
  std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
  emplace_back<std::__cxx11::string,std::shared_ptr<mocker::nasm::BinaryInst>>
            ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&this->lines,label,
             &local_40);
  std::shared_ptr<mocker::nasm::BinaryInst>::~shared_ptr(&local_40);
  return;
}

Assistant:

void emplaceLine(std::string label, Args &&... args) {
    lines.emplace_back(std::move(label),
                       std::make_shared<Type>(std::forward<Args>(args)...));
  }